

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O2

void sysbvm_dwarf_cfi_beginCIE(sysbvm_dwarf_cfi_builder_t *cfi,sysbvm_dwarf_cie_t *cie)

{
  uintptr_t uVar1;
  intptr_t iVar2;
  uintptr_t uVar3;
  undefined7 uVar4;
  size_t sVar5;
  char *cstring;
  
  sVar5 = sysbvm_dwarf_encodeDWord(&cfi->buffer,0);
  cfi->cieOffset = sVar5;
  sVar5 = sysbvm_dwarf_encodeDwarfPointer(&cfi->buffer,-(cfi->isEhFrame ^ 1));
  cfi->cieContentOffset = sVar5;
  uVar4 = *(undefined7 *)&cie->field_0x1;
  uVar1 = cie->codeAlignmentFactor;
  iVar2 = cie->dataAlignmentFactor;
  uVar3 = cie->returnAddressRegister;
  (cfi->cie).pointerSize = cie->pointerSize;
  *(undefined7 *)&(cfi->cie).field_0x1 = uVar4;
  (cfi->cie).codeAlignmentFactor = uVar1;
  (cfi->cie).dataAlignmentFactor = iVar2;
  (cfi->cie).returnAddressRegister = uVar3;
  sysbvm_dwarf_encodeByte(&cfi->buffer,cfi->version);
  cstring = "";
  if (cfi->isEhFrame != false) {
    cstring = "zR";
  }
  sysbvm_dwarf_encodeCString(&cfi->buffer,cstring);
  if (cfi->isEhFrame == false) {
    sysbvm_dwarf_encodeByte(&cfi->buffer,'\b');
    sysbvm_dwarf_encodeByte(&cfi->buffer,'\0');
  }
  sysbvm_dwarf_encodeULEB128(&cfi->buffer,cie->codeAlignmentFactor);
  sysbvm_dwarf_encodeSLEB128(&cfi->buffer,cie->dataAlignmentFactor);
  if ((cfi->version < 3) && (cfi->isEhFrame == false)) {
    sysbvm_dwarf_encodeByte(&cfi->buffer,(uint8_t)cie->returnAddressRegister);
  }
  else {
    sysbvm_dwarf_encodeULEB128(&cfi->buffer,cie->returnAddressRegister);
  }
  if (cfi->isEhFrame == true) {
    sysbvm_dwarf_encodeULEB128(&cfi->buffer,1);
    sysbvm_dwarf_encodeByte(&cfi->buffer,'\x1b');
    return;
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_dwarf_cfi_beginCIE(sysbvm_dwarf_cfi_builder_t *cfi, sysbvm_dwarf_cie_t *cie)
{
    cfi->cieOffset = sysbvm_dwarf_encodeDWord(&cfi->buffer, 0);
    cfi->cieContentOffset = sysbvm_dwarf_encodeDwarfPointer(&cfi->buffer, cfi->isEhFrame ? 0 : -1 ); // CIE_id
    cfi->cie = *cie;
    sysbvm_dwarf_encodeByte(&cfi->buffer, cfi->version);
    sysbvm_dwarf_encodeCString(&cfi->buffer, cfi->isEhFrame ? "zR" : ""); // Argumentation
    if(!cfi->isEhFrame)
    {
        sysbvm_dwarf_encodeByte(&cfi->buffer, sizeof(uintptr_t)); // Address size
        sysbvm_dwarf_encodeByte(&cfi->buffer, 0); // Segment size
    }
    sysbvm_dwarf_encodeULEB128(&cfi->buffer, cie->codeAlignmentFactor);
    sysbvm_dwarf_encodeSLEB128(&cfi->buffer, cie->dataAlignmentFactor);
    if(cfi->version <= 2 && !cfi->isEhFrame)
        sysbvm_dwarf_encodeByte(&cfi->buffer, (uint8_t)cie->returnAddressRegister);
    else
        sysbvm_dwarf_encodeULEB128(&cfi->buffer, cie->returnAddressRegister);
    if(cfi->isEhFrame)
    {
        sysbvm_dwarf_encodeULEB128(&cfi->buffer, 1);
        sysbvm_dwarf_encodeByte(&cfi->buffer, DW_EH_PE_pcrel | DW_EH_PE_sdata4);
    }
}